

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O3

void __thiscall
inja::ForObjectStatementNode::ForObjectStatementNode
          (ForObjectStatementNode *this,string *key,string *value,BlockNode *parent,size_t pos)

{
  pointer pcVar1;
  
  (this->super_ForStatementNode).super_StatementNode.super_AstNode.pos = pos;
  (this->super_ForStatementNode).condition.super_AstNode.pos = 0;
  (this->super_ForStatementNode).condition.super_AstNode._vptr_AstNode =
       (_func_int **)&PTR_accept_001546b0;
  (this->super_ForStatementNode).condition.root.
  super___shared_ptr<inja::ExpressionNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_ForStatementNode).condition.root.
  super___shared_ptr<inja::ExpressionNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_ForStatementNode).body.super_AstNode.pos = 0;
  (this->super_ForStatementNode).body.super_AstNode._vptr_AstNode =
       (_func_int **)&PTR_accept_00154078;
  (this->super_ForStatementNode).body.nodes.
  super__Vector_base<std::shared_ptr<inja::AstNode>,_std::allocator<std::shared_ptr<inja::AstNode>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ForStatementNode).body.nodes.
  super__Vector_base<std::shared_ptr<inja::AstNode>,_std::allocator<std::shared_ptr<inja::AstNode>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ForStatementNode).body.nodes.
  super__Vector_base<std::shared_ptr<inja::AstNode>,_std::allocator<std::shared_ptr<inja::AstNode>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ForStatementNode).parent = parent;
  (this->super_ForStatementNode).super_StatementNode.super_AstNode._vptr_AstNode =
       (_func_int **)&PTR_accept_001547d0;
  (this->key)._M_dataplus._M_p = (pointer)&(this->key).field_2;
  pcVar1 = (key->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->key,pcVar1,pcVar1 + key->_M_string_length);
  (this->value)._M_dataplus._M_p = (pointer)&(this->value).field_2;
  pcVar1 = (value->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->value,pcVar1,pcVar1 + value->_M_string_length);
  return;
}

Assistant:

explicit ForObjectStatementNode(const std::string& key, const std::string& value, BlockNode* const parent, size_t pos)
      : ForStatementNode(parent, pos), key(key), value(value) {}